

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataStructures.pb.cc
# Opt level: O2

void __thiscall CoreML::Specification::FloatVector::FloatVector(FloatVector *this,FloatVector *from)

{
  (this->super_MessageLite)._internal_metadata_.ptr_ = 0;
  (this->super_MessageLite)._vptr_MessageLite = (_func_int **)&PTR__FloatVector_003f83b0;
  google::protobuf::RepeatedField<float>::RepeatedField(&this->vector_,&from->vector_);
  (this->_cached_size_).size_.super___atomic_base<int>._M_i = 0;
  google::protobuf::internal::InternalMetadata::MergeFrom<std::__cxx11::string>
            (&(this->super_MessageLite)._internal_metadata_,
             &(from->super_MessageLite)._internal_metadata_);
  return;
}

Assistant:

FloatVector::FloatVector(const FloatVector& from)
  : ::PROTOBUF_NAMESPACE_ID::MessageLite(),
      vector_(from.vector_) {
  _internal_metadata_.MergeFrom<std::string>(from._internal_metadata_);
  // @@protoc_insertion_point(copy_constructor:CoreML.Specification.FloatVector)
}